

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t encoder_7bit_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (size == 0) {
    return 0xfffffffffffffffe;
  }
  sVar4 = (part->encstate).bufbeg;
  uVar3 = (part->encstate).bufend - sVar4;
  if (uVar3 == 0) {
    return 0;
  }
  if (uVar3 < size) {
    size = uVar3;
  }
  sVar2 = size + (size == 0);
  uVar3 = 0;
  do {
    cVar1 = (part->encstate).buf[sVar4];
    buffer[uVar3] = cVar1;
    if (cVar1 < '\0') {
      return -(ulong)(uVar3 == 0) | uVar3;
    }
    sVar4 = (part->encstate).bufbeg + 1;
    (part->encstate).bufbeg = sVar4;
    uVar3 = uVar3 + 1;
  } while (sVar2 != uVar3);
  return sVar2;
}

Assistant:

static size_t encoder_7bit_read(char *buffer, size_t size, bool ateof,
                                curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  size_t cursize = st->bufend - st->bufbeg;

  (void) ateof;

  if(!size)
    return STOP_FILLING;

  if(size > cursize)
    size = cursize;

  for(cursize = 0; cursize < size; cursize++) {
    *buffer = st->buf[st->bufbeg];
    if(*buffer++ & 0x80)
      return cursize ? cursize : READ_ERROR;
    st->bufbeg++;
  }

  return cursize;
}